

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,uint8 *target,
          EpsCopyOutputStream *stream)

{
  ushort uVar1;
  KeyValue *this_00;
  KeyValue *pKVar2;
  iterator iVar3;
  int local_2c;
  
  this_00 = (this->map_).flat;
  local_2c = start_field_number;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    for (pKVar2 = std::
                  __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                            (this_00,this_00 + uVar1,&local_2c);
        (pKVar2 != this_00 + uVar1 && (pKVar2->first < end_field_number)); pKVar2 = pKVar2 + 1) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         (&pKVar2->second,pKVar2->first,target,stream);
    }
  }
  else {
    for (iVar3 = std::
                 _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                 ::lower_bound((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                                *)this_00,&local_2c);
        ((_Rb_tree_header *)iVar3._M_node != (_Rb_tree_header *)&this_00->second &&
        ((int)iVar3._M_node[1]._M_color < end_field_number));
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node)) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         ((Extension *)&iVar3._M_node[1]._M_parent,iVar3._M_node[1]._M_color,target,
                          stream);
    }
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number, uint8* target,
    io::EpsCopyOutputStream* stream) const {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    const auto& end = map_.large->end();
    for (auto it = map_.large->lower_bound(start_field_number);
         it != end && it->first < end_field_number; ++it) {
      target = it->second.InternalSerializeFieldWithCachedSizesToArray(
          it->first, target, stream);
    }
    return target;
  }
  const KeyValue* end = flat_end();
  for (const KeyValue* it = std::lower_bound(
           flat_begin(), end, start_field_number, KeyValue::FirstComparator());
       it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        it->first, target, stream);
  }
  return target;
}